

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O0

list<int,_std::allocator<int>_> * __thiscall
la::LevenshteinNFA::Move
          (list<int,_std::allocator<int>_> *__return_storage_ptr__,LevenshteinNFA *this,
          list<int,_std::allocator<int>_> *states,char inp)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  const_reference pvVar4;
  value_type local_b0;
  value_type vStack_ac;
  char c_1;
  int j_1;
  int now;
  int iStack_a0;
  char c;
  size_t j;
  _Self local_90;
  const_iterator it;
  bool findNormalLetter;
  bool needNormalLetter;
  undefined1 local_78 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  char inp_local;
  list<int,_std::allocator<int>_> *states_local;
  LevenshteinNFA *this_local;
  list<int,_std::allocator<int>_> *result;
  
  tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._6_1_ = 0;
  tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._7_1_ = inp;
  std::__cxx11::list<int,_std::allocator<int>_>::list(__return_storage_ptr__);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_78);
  it._M_node._3_1_ = 0;
  it._M_node._2_1_ = 0;
  if ((tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
       _M_node._7_1_ != '~') &&
     (tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_node._7_1_ != '|')) {
    it._M_node._3_1_ = 1;
  }
  local_90._M_node =
       (_List_node_base *)std::begin<std::__cxx11::list<int,std::allocator<int>>>(states);
  while( true ) {
    j = (size_t)std::end<std::__cxx11::list<int,std::allocator<int>>>(states);
    bVar1 = std::operator==(&local_90,(_Self *)&j);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    for (_iStack_a0 = 0; _iStack_a0 < this->_size; _iStack_a0 = _iStack_a0 + 1) {
      piVar2 = std::_List_const_iterator<int>::operator*(&local_90);
      pvVar4 = std::vector<char,_std::allocator<char>_>::at
                         (&this->_transTable,(long)*piVar2 * this->_size + _iStack_a0);
      now._3_1_ = *pvVar4;
      if (((now._3_1_ ==
            tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node._7_1_) || (now._3_1_ == '~')) || (now._3_1_ == '|')) {
        if (((it._M_node._3_1_ & 1) != 0) &&
           (now._3_1_ ==
            tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node._7_1_)) {
          it._M_node._2_1_ = 1;
        }
        j_1 = iStack_a0;
        std::__cxx11::list<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&j_1);
      }
    }
    std::_List_const_iterator<int>::operator++(&local_90);
  }
  while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
    vStack_ac = *pvVar3;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
    for (local_b0 = 0; (ulong)(long)local_b0 < this->_size; local_b0 = local_b0 + 1) {
      pvVar4 = std::vector<char,_std::allocator<char>_>::at
                         (&this->_transTable,(long)vStack_ac * this->_size + (long)local_b0);
      if (*pvVar4 == '|') {
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78,&local_b0);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_b0);
      }
    }
  }
  if (((it._M_node._3_1_ & 1) != 0) && ((it._M_node._2_1_ & 1) == 0)) {
    std::__cxx11::list<int,_std::allocator<int>_>::clear(__return_storage_ptr__);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::sort(__return_storage_ptr__);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(__return_storage_ptr__);
  tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._6_1_ = 1;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
  if ((tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
       _M_node._6_1_ & 1) == 0) {
    std::__cxx11::list<int,_std::allocator<int>_>::~list(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<int> LevenshteinNFA::Move(const std::list<int> &states, char inp) const
    {
        std::list<int> result;
        std::queue<int> tmp;
        bool needNormalLetter = false;
        bool findNormalLetter = false;
        if (inp != (char)LevenshteinNFA::Constants::Insertion &&
            inp != (char)LevenshteinNFA::Constants::Deletion)
            needNormalLetter = true;
        for (auto it = std::begin(states); it != std::end(states); ++it)
        {
            for (decltype(_size) j = 0; j < _size; j++)
            {
                char c = _transTable.at((*it * _size) + j);
                if (c == inp || c == (char)LevenshteinNFA::Constants::Insertion || c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    if (needNormalLetter && c == inp)
                        findNormalLetter = true;
                    result.push_back(j);
                }
            }
        }
        while (!tmp.empty())
        {
            int now = tmp.front();
            tmp.pop();
            for (int j = 0; j < _size; j++)
            {
                char c = _transTable.at((now * _size) + j);
                if (c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    tmp.push(j);
                    result.push_back(j);
                }
            }
        }
        if (needNormalLetter && !findNormalLetter)
            result.clear();
        result.sort();
        result.unique();
        return result;
    }